

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  pointer pCVar1;
  ulong uVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  string padding;
  string col;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  lVar4 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  padding._M_string_length = 0;
  padding.field_2._M_local_buf[0] = '\0';
  for (uVar5 = 0;
      pCVar1 = (this->m_columns->
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->m_columns->
                            super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 6);
      uVar5 = uVar5 + 1) {
    uVar2 = *(ulong *)((long)&pCVar1->m_width + lVar4);
    pcVar3 = (this->m_iterators).
             super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((*(long *)((long)&(pcVar3->m_lineStart).m_it._M_current + lVar4) ==
         *(long *)((long)&(pCVar1->m_string).m_string + lVar4) +
         *(long *)((long)&(pCVar1->m_string).m_string + lVar4 + 8)) &&
       ((long)&(pCVar1->m_string).m_string + lVar4 == *(long *)((long)&pcVar3->m_column + lVar4))) {
      std::__cxx11::string::append((ulong)&padding,(char)uVar2);
    }
    else {
      Column::const_iterator::operator*[abi_cxx11_
                (&col,(const_iterator *)((long)&pcVar3->m_column + lVar4));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      padding._M_string_length = 0;
      *padding._M_dataplus._M_p = '\0';
      if (col._M_string_length <= uVar2 && uVar2 - col._M_string_length != 0) {
        std::__cxx11::string::append((ulong)&padding,(char)(uVar2 - col._M_string_length));
      }
      std::__cxx11::string::~string((string *)&col);
    }
    lVar4 = lVar4 + 0x40;
  }
  std::__cxx11::string::~string((string *)&padding);
  return __return_storage_ptr__;
}

Assistant:

std::string Columns::iterator::operator*() const {
            std::string row, padding;

            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                const auto width = m_columns[i].width();
                if ( m_iterators[i] != m_columns[i].end() ) {
                    std::string col = *m_iterators[i];
                    row += padding;
                    row += col;

                    padding.clear();
                    if ( col.size() < width ) {
                        padding.append( width - col.size(), ' ' );
                    }
                } else {
                    padding.append( width, ' ' );
                }
            }
            return row;
        }